

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O3

ssize_t __thiscall
zmq::detail::socket_base::send(socket_base *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  error_t *this_00;
  undefined4 in_register_00000034;
  
  uVar1 = zmq_send(this->_handle,*(undefined8 *)CONCAT44(in_register_00000034,__fd),
                   ((undefined8 *)CONCAT44(in_register_00000034,__fd))[1],(ulong)__buf & 0xffffffff)
  ;
  if ((int)uVar1 < 0) {
    iVar2 = zmq_errno();
    if (iVar2 != 0xb) {
      this_00 = (error_t *)__cxa_allocate_exception(0x10);
      error_t::error_t(this_00);
      __cxa_throw(this_00,&error_t::typeinfo,std::exception::~exception);
    }
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)uVar1;
  }
  return uVar3;
}

Assistant:

inline size_t send(std::string const& msg, send_flags flags = send_flags::none)
		{
			int nbytes = zmq_send(_handle, (void *)msg.c_str(), msg.size(), static_cast<int>(flags));
			if (nbytes >= 0)
				return (size_t)nbytes;
			if (zmq_errno() == EAGAIN)
				return 0;
			throw error_t();
		}